

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O1

int filter_register(kqueue *kq,filter *src)

{
  ushort uVar1;
  int iVar2;
  filter *__dest;
  
  uVar1 = src->kf_id;
  if (uVar1 != 0) {
    if (uVar1 < 0xfff4) {
      return -1;
    }
    uVar1 = ~uVar1;
    __dest = (filter *)((long)&kq->kq_filt[0].kf_id + (ulong)((uint)uVar1 * 0xa0));
    memcpy(__dest,src,0xa0);
    *(kqueue **)((long)&kq->kq_filt[0].kf_kqueue + (ulong)((uint)uVar1 * 0xa0)) = kq;
    *(undefined8 *)((long)&kq->kq_filt[0].kf_index.rbh_root + (ulong)((uint)uVar1 * 0xa0)) = 0;
    if (((src->kf_id != 0) && (src->kf_init != (_func_int_filter_ptr *)0x0)) &&
       (iVar2 = (*src->kf_init)(__dest), iVar2 < 0)) {
      __dest->kf_id = 0;
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
filter_register(struct kqueue *kq, const struct filter *src)
{
    struct filter *dst;
    unsigned int filt;
    int rv = 0;

    /*
     * This filter is not implemented, see EVFILT_NOTIMPL.
     */
    if (src->kf_id == 0) return (0);

    filt = (-1 * src->kf_id) - 1; /* flip sign, and convert to array offset */
    if (filt >= EVFILT_SYSCOUNT)
        return (-1);

    dst = &kq->kq_filt[filt];
    memcpy(dst, src, sizeof(*src));
    dst->kf_kqueue = kq;
    RB_INIT(&dst->kf_index);

    if (src->kf_id == 0) {
        dbg_puts("filter is not implemented");
        return (0);
    }

    assert(src->kf_copyout);
    assert(src->kn_create);
    assert(src->kn_modify);
    assert(src->kn_delete);
    assert(src->kn_enable);
    assert(src->kn_disable);

    /* Perform (optional) per-filter initialization */
    if (src->kf_init != NULL) {
        rv = src->kf_init(dst);
        if (rv < 0) {
            dbg_puts("filter failed to initialize");
            dst->kf_id = 0;
            return (-1);
        }
    }

    /* FIXME: should totally remove const from src */
    if ((kqops.filter_init != NULL) && (kqops.filter_init(kq, dst) < 0))
        return (-1);

    return (0);
}